

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
::
AssertHashEqConsistent<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
           *this,pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                 *key)

{
  undefined1 auVar1 [16];
  Message *pMVar2;
  FieldDescriptor *pFVar3;
  uint uVar4;
  long lVar5;
  undefined1 *puVar6;
  uintptr_t v;
  slot_type *psVar7;
  uintptr_t v_3;
  undefined1 (*pauVar8) [16];
  uintptr_t v_15;
  uint uVar9;
  uintptr_t v_12;
  ushort uVar10;
  uintptr_t v_21;
  ulong uVar11;
  uintptr_t v_18;
  ulong uVar12;
  ulong uVar13;
  
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              *)this);
  if (1 < *(ulong *)(this + 8)) {
    uVar12 = ((ulong)key->first ^ 0x589848) * -0x234dd359734ecb13;
    uVar12 = ((uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
               (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
               (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28
              | uVar12 << 0x38) ^ (ulong)key->first) * -0x234dd359734ecb13;
    uVar12 = ((uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
               (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
               (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28
              | uVar12 << 0x38) ^ (ulong)key->second) * -0x234dd359734ecb13;
    uVar13 = (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
              (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
              (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28 |
             uVar12 << 0x38) ^ (ulong)key->second;
    uVar12 = *(ulong *)this;
    if (uVar12 == 1) {
      psVar7 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
               ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                           *)this);
      pMVar2 = psVar7->first;
      if ((pMVar2 == key->first) && (pFVar3 = psVar7->second, pFVar3 == key->second)) {
        uVar12 = ((ulong)pMVar2 ^ 0x589848) * -0x234dd359734ecb13;
        uVar12 = ((uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                   (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                   (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                   (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38) ^ (ulong)pMVar2) *
                 -0x234dd359734ecb13;
        uVar12 = ((uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                   (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                   (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                   (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38) ^ (ulong)pFVar3) *
                 -0x234dd359734ecb13;
        if (uVar13 != ((uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                        (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                        (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                        (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38) ^ (ulong)pFVar3)) {
LAB_002c2bbc:
          __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xfbf,
                        "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::AssertHashEqConsistent(const std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *> &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                       );
        }
      }
    }
    else {
      if (uVar12 == 0) {
        __assert_fail("cap >= kDefaultCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xb75,
                      "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                     );
      }
      if (uVar12 < 0x11) {
        psVar7 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                 ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                               *)this);
        uVar12 = *(ulong *)this;
        pauVar8 = *(undefined1 (**) [16])(this + 0x10);
        if (uVar12 < 0xf) {
          if (8 < uVar12) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          uVar12 = *(ulong *)(*pauVar8 + uVar12) & 0x8080808080808080;
          if (uVar12 != 0x8080808080808080) {
            uVar12 = uVar12 ^ 0x8080808080808080;
            do {
              lVar5 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              uVar11 = (ulong)((uint)lVar5 & 0xfffffff8);
              pMVar2 = *(Message **)((long)&psVar7[-1].first + uVar11 * 2);
              if ((pMVar2 == key->first) &&
                 (pFVar3 = *(FieldDescriptor **)((long)psVar7 + uVar11 * 2 + -8),
                 pFVar3 == key->second)) {
                uVar11 = ((ulong)pMVar2 ^ 0x589848) * -0x234dd359734ecb13;
                uVar11 = ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                           (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                           (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                           (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^ (ulong)pMVar2) *
                         -0x234dd359734ecb13;
                uVar11 = ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                           (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                           (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                           (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^ (ulong)pFVar3) *
                         -0x234dd359734ecb13;
                if (uVar13 != ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                                (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                                (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                                (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^ (ulong)pFVar3))
                goto LAB_002c2bbc;
              }
              uVar12 = uVar12 & uVar12 - 1;
            } while (uVar12 != 0);
          }
        }
        else if (1 < *(ulong *)(this + 8)) {
          uVar12 = *(ulong *)(this + 8) >> 1;
          while( true ) {
            auVar1 = *pauVar8;
            uVar9 = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar1[0xf] >> 7) << 0xf);
            if (uVar9 != 0xffff) {
              uVar9 = ~uVar9;
              do {
                uVar4 = 0;
                if (uVar9 != 0) {
                  for (; (uVar9 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                  }
                }
                if ((char)(*pauVar8)[uVar4] < '\0') {
                  __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                ,0x79d,
                                "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                               );
                }
                pMVar2 = *(Message **)((long)&psVar7->first + (ulong)(uVar4 << 4));
                if ((pMVar2 == key->first) &&
                   (pFVar3 = *(FieldDescriptor **)((long)&psVar7->second + (ulong)(uVar4 << 4)),
                   pFVar3 == key->second)) {
                  uVar11 = ((ulong)pMVar2 ^ 0x589848) * -0x234dd359734ecb13;
                  uVar11 = ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                             (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                             (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                             (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^ (ulong)pMVar2) *
                           -0x234dd359734ecb13;
                  uVar11 = ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                             (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                             (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                             (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^ (ulong)pFVar3) *
                           -0x234dd359734ecb13;
                  if (uVar13 != ((uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                                  (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                                  (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                                  (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^ (ulong)pFVar3))
                  goto LAB_002c2bbc;
                }
                uVar12 = uVar12 - 1;
                uVar10 = (ushort)(uVar9 - 1) & (ushort)uVar9;
                uVar9 = CONCAT22((short)(uVar9 - 1 >> 0x10),uVar10);
              } while (uVar10 != 0);
            }
            if (uVar12 == 0) break;
            psVar7 = psVar7 + 0x10;
            puVar6 = *pauVar8;
            pauVar8 = pauVar8 + 1;
            if (puVar6[0xf] == -1) {
              __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7a5,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                           );
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void AssertHashEqConsistent(const K& key) {
#ifdef NDEBUG
    return;
#endif
    // If the hash/eq functors are known to be consistent, then skip validation.
    if (std::is_same<hasher, absl::container_internal::StringHash>::value &&
        std::is_same<key_equal, absl::container_internal::StringEq>::value) {
      return;
    }
    if (std::is_scalar<key_type>::value &&
        std::is_same<hasher, absl::Hash<key_type>>::value &&
        std::is_same<key_equal, std::equal_to<key_type>>::value) {
      return;
    }
    if (empty()) return;

    const size_t hash_of_arg = hash_ref()(key);
    const auto assert_consistent = [&](const ctrl_t*, slot_type* slot) {
      const value_type& element = PolicyTraits::element(slot);
      const bool is_key_equal =
          PolicyTraits::apply(EqualElement<K>{key, eq_ref()}, element);
      if (!is_key_equal) return;

      const size_t hash_of_slot =
          PolicyTraits::apply(HashElement{hash_ref()}, element);
      ABSL_ATTRIBUTE_UNUSED const bool is_hash_equal =
          hash_of_arg == hash_of_slot;
      assert((!is_key_equal || is_hash_equal) &&
             "eq(k1, k2) must imply that hash(k1) == hash(k2). "
             "hash/eq functors are inconsistent.");
    };

    if (is_soo()) {
      assert_consistent(/*unused*/ nullptr, soo_slot());
      return;
    }
    // We only do validation for small tables so that it's constant time.
    if (capacity() > 16) return;
    IterateOverFullSlots(common(), slot_array(), assert_consistent);
  }